

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O1

void __thiscall FormatTest_StrError_Test::TestBody(FormatTest_StrError_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  size_t message_size;
  string gtest_expected_message;
  char *message;
  int result;
  char buffer [256];
  AssertionResult local_178;
  AssertHelper local_168;
  AssertHelper local_160;
  string local_158;
  char (*local_138) [256];
  int local_12c;
  char local_128 [264];
  
  local_138 = (char (*) [256])0x0;
  testing::AssertionSuccess();
  if ((internal)local_178.success_ == (internal)0x1) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"invalid buffer","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (char (*) [256])0x0;
      fmt::v5::anon_unknown_10::safe_strerror(0x21,(char **)&local_138,0);
    }
    testing::AssertionResult::operator<<
              (&local_178,
               (char (*) [131])
               "Expected: fmt::safe_strerror(33, message = nullptr, 0) throws an exception of type assertion_failure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_158);
  if (local_178.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_178.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
             ,0x8e,pcVar2);
  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_158._M_dataplus._M_p + 8))();
    }
    local_158._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((internal)local_178.success_ == (internal)0x1) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"invalid buffer","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_138 = (char (*) [256])local_128;
      fmt::v5::anon_unknown_10::safe_strerror(0x21,(char **)&local_138,0);
    }
    testing::AssertionResult::operator<<
              (&local_178,
               (char (*) [130])
               "Expected: fmt::safe_strerror(33, message = buffer, 0) throws an exception of type assertion_failure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_158);
  if (local_178.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_178.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
             ,0x90,pcVar2);
  testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_158._M_dataplus._M_p + 8))();
    }
    local_158._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_128[0] = 'x';
  local_138 = (char (*) [256])local_128;
  local_12c = fmt::v5::anon_unknown_10::safe_strerror(-1,(char **)&local_138,0x100);
  local_178._0_8_ = (ulong)(uint)local_178._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_158,"result","0",&local_12c,(int *)&local_178);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_158._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_158._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_160.data_ = (AssertHelperData *)strlen(*local_138);
  local_178._0_4_ = 0xff;
  testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
            ((internal *)&local_158,"BUFFER_SIZE - 1u","message_size",(uint *)&local_178,
             (unsigned_long *)&local_160);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_158._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_158._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  get_system_error_abi_cxx11_(&local_158,-1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char*>
            ((internal *)&local_178,"get_system_error(error_code)","message",&local_158,
             (char **)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((internal)local_178.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_178.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_178.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_158._M_dataplus._M_p + 8))();
      }
      local_158._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_138 = (char (*) [256])local_128;
  local_12c = fmt::v5::anon_unknown_10::safe_strerror
                        (-1,(char **)&local_138,(size_t)local_160.data_);
  local_178._0_4_ = 0x22;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_158,"34","result",(int *)&local_178,&local_12c);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_158._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_158._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_138 = (char (*) [256])local_128;
  local_12c = fmt::v5::anon_unknown_10::safe_strerror(-1,(char **)&local_138,1);
  testing::internal::CmpHelperEQ<char[256],char*>
            ((internal *)&local_158,"buffer","message",(char (*) [256])local_128,(char **)&local_138
            );
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_158._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_158._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178._0_4_ = 0x22;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_158,"34","result",(int *)&local_178,&local_12c);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_158._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_158._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ((internal *)&local_158,"\"\"","message","",*local_138);
  if ((char)local_158._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_178);
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      pcVar2 = *(char **)local_158._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
      local_178._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, StrError) {
  char *message = FMT_NULL;
  char buffer[BUFFER_SIZE];
  EXPECT_ASSERT(fmt::safe_strerror(EDOM, message = FMT_NULL, 0),
                "invalid buffer");
  EXPECT_ASSERT(fmt::safe_strerror(EDOM, message = buffer, 0),
                "invalid buffer");
  buffer[0] = 'x';
#if defined(_GNU_SOURCE) && !defined(__COVERITY__)
  // Use invalid error code to make sure that safe_strerror returns an error
  // message in the buffer rather than a pointer to a static string.
  int error_code = -1;
#else
  int error_code = EDOM;
#endif

  int result = fmt::safe_strerror(error_code, message = buffer, BUFFER_SIZE);
  EXPECT_EQ(result, 0);
  std::size_t message_size = std::strlen(message);
  EXPECT_GE(BUFFER_SIZE - 1u, message_size);
  EXPECT_EQ(get_system_error(error_code), message);

  // safe_strerror never uses buffer on MinGW.
#ifndef __MINGW32__
  result = fmt::safe_strerror(error_code, message = buffer, message_size);
  EXPECT_EQ(ERANGE, result);
  result = fmt::safe_strerror(error_code, message = buffer, 1);
  EXPECT_EQ(buffer, message);  // Message should point to buffer.
  EXPECT_EQ(ERANGE, result);
  EXPECT_STREQ("", message);
#endif
}